

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void aom_h_predictor_8x4_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined8 uVar1;
  uint8_t *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined1 local_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined1 uStack_a4;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  __m128i row3;
  __m128i row2;
  __m128i row1;
  __m128i row0;
  __m128i left_col;
  uint8_t *left_local;
  uint8_t *above_local;
  ptrdiff_t stride_local;
  uint8_t *dst_local;
  
  uVar1 = *(undefined8 *)left;
  local_a8 = (undefined1)uVar1;
  uStack_a7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_a6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_a5 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_a4 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_a3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_a2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_a1 = (undefined1)((ulong)uVar1 >> 0x38);
  auVar3[1] = local_a8;
  auVar3[0] = local_a8;
  auVar3[2] = uStack_a7;
  auVar3[3] = uStack_a7;
  auVar3[4] = uStack_a6;
  auVar3[5] = uStack_a6;
  auVar3[6] = uStack_a5;
  auVar3[7] = uStack_a5;
  auVar3[8] = uStack_a4;
  auVar3[9] = uStack_a4;
  auVar3[10] = uStack_a3;
  auVar3[0xb] = uStack_a3;
  auVar3[0xc] = uStack_a2;
  auVar3[0xd] = uStack_a2;
  auVar3[0xe] = uStack_a1;
  auVar3[0xf] = uStack_a1;
  auVar3 = pshuflw(auVar3,auVar3,0);
  auVar4[1] = local_a8;
  auVar4[0] = local_a8;
  auVar4[2] = uStack_a7;
  auVar4[3] = uStack_a7;
  auVar4[4] = uStack_a6;
  auVar4[5] = uStack_a6;
  auVar4[6] = uStack_a5;
  auVar4[7] = uStack_a5;
  auVar4[8] = uStack_a4;
  auVar4[9] = uStack_a4;
  auVar4[10] = uStack_a3;
  auVar4[0xb] = uStack_a3;
  auVar4[0xc] = uStack_a2;
  auVar4[0xd] = uStack_a2;
  auVar4[0xe] = uStack_a1;
  auVar4[0xf] = uStack_a1;
  auVar4 = pshuflw(auVar4,auVar4,0x55);
  auVar5[1] = local_a8;
  auVar5[0] = local_a8;
  auVar5[2] = uStack_a7;
  auVar5[3] = uStack_a7;
  auVar5[4] = uStack_a6;
  auVar5[5] = uStack_a6;
  auVar5[6] = uStack_a5;
  auVar5[7] = uStack_a5;
  auVar5[8] = uStack_a4;
  auVar5[9] = uStack_a4;
  auVar5[10] = uStack_a3;
  auVar5[0xb] = uStack_a3;
  auVar5[0xc] = uStack_a2;
  auVar5[0xd] = uStack_a2;
  auVar5[0xe] = uStack_a1;
  auVar5[0xf] = uStack_a1;
  auVar5 = pshuflw(auVar5,auVar5,0xaa);
  auVar6[1] = local_a8;
  auVar6[0] = local_a8;
  auVar6[2] = uStack_a7;
  auVar6[3] = uStack_a7;
  auVar6[4] = uStack_a6;
  auVar6[5] = uStack_a6;
  auVar6[6] = uStack_a5;
  auVar6[7] = uStack_a5;
  auVar6[8] = uStack_a4;
  auVar6[9] = uStack_a4;
  auVar6[10] = uStack_a3;
  auVar6[0xb] = uStack_a3;
  auVar6[0xc] = uStack_a2;
  auVar6[0xd] = uStack_a2;
  auVar6[0xe] = uStack_a1;
  auVar6[0xf] = uStack_a1;
  auVar6 = pshuflw(auVar6,auVar6,0xff);
  local_f8 = auVar3._0_8_;
  *(undefined8 *)dst = local_f8;
  puVar2 = dst + stride;
  local_108 = auVar4._0_8_;
  *(undefined8 *)puVar2 = local_108;
  local_118 = auVar5._0_8_;
  *(undefined8 *)(puVar2 + stride) = local_118;
  local_128 = auVar6._0_8_;
  *(undefined8 *)(puVar2 + stride + stride) = local_128;
  return;
}

Assistant:

void aom_h_predictor_8x4_sse2(uint8_t *dst, ptrdiff_t stride,
                              const uint8_t *above, const uint8_t *left) {
  (void)above;
  __m128i left_col = _mm_loadl_epi64((__m128i const *)left);
  left_col = _mm_unpacklo_epi8(left_col, left_col);
  __m128i row0 = _mm_shufflelo_epi16(left_col, 0);
  __m128i row1 = _mm_shufflelo_epi16(left_col, 0x55);
  __m128i row2 = _mm_shufflelo_epi16(left_col, 0xaa);
  __m128i row3 = _mm_shufflelo_epi16(left_col, 0xff);
  _mm_storel_epi64((__m128i *)dst, row0);
  dst += stride;
  _mm_storel_epi64((__m128i *)dst, row1);
  dst += stride;
  _mm_storel_epi64((__m128i *)dst, row2);
  dst += stride;
  _mm_storel_epi64((__m128i *)dst, row3);
}